

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  void *pvVar1;
  xmlInputReadCallback p_Var2;
  int iVar3;
  xmlBufPtr buf;
  xmlChar *pxVar4;
  uint uVar5;
  size_t sizeOut;
  
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  uVar5 = 4000;
  if (4000 < len) {
    uVar5 = len;
  }
  if (in->readcallback == (xmlInputReadCallback)0x0) {
    sizeOut._0_4_ = 0;
LAB_0015a672:
    if (in->encoder != (xmlCharEncodingHandlerPtr)0x0) {
      sizeOut = -(ulong)(in->readcallback != (xmlInputReadCallback)0x0) | (ulong)uVar5;
      iVar3 = xmlCharEncInput(in,&sizeOut);
      if (iVar3 < 0) {
        sizeOut._0_4_ = 0xffffffff;
      }
      else {
      }
    }
  }
  else {
    if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      buf = in->buffer;
LAB_0015a61e:
      iVar3 = xmlBufGrow(buf,(ulong)uVar5);
      if (-1 < iVar3) {
        pvVar1 = in->context;
        p_Var2 = in->readcallback;
        pxVar4 = xmlBufEnd(buf);
        sizeOut._0_4_ = (*p_Var2)(pvVar1,(char *)pxVar4,uVar5);
        if (((int)(uint)sizeOut < 1) && (in->readcallback = endOfInput, (int)(uint)sizeOut < 0)) {
          iVar3 = 0x5dc;
          if ((uint)sizeOut != 0xffffffff) {
            iVar3 = -(uint)sizeOut;
          }
          in->error = iVar3;
          return -1;
        }
        iVar3 = xmlBufAddLen(buf,(ulong)(uint)sizeOut);
        if (-1 < iVar3) goto LAB_0015a672;
      }
    }
    else {
      buf = in->raw;
      if (buf != (xmlBufPtr)0x0) goto LAB_0015a61e;
      buf = xmlBufCreate(6000);
      in->raw = buf;
      if (buf != (xmlBufPtr)0x0) goto LAB_0015a61e;
    }
    in->error = 2;
    sizeOut._0_4_ = 0xffffffff;
  }
  return (uint)sizeOut;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    int res = 0;

    if ((in == NULL) || (in->error))
        return(-1);

    if (len < MINLEN)
        len = MINLEN;

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
        xmlBufPtr buf;

        if (in->encoder == NULL) {
            buf = in->buffer;
        } else {
            /*
             * Some users only set 'encoder' and expect us to create
             * the raw buffer lazily.
             */
            if (in->raw == NULL) {
                in->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
                if (in->raw == NULL) {
                    in->error = XML_ERR_NO_MEMORY;
                    return(-1);
                }
            }
            buf = in->raw;
        }

        if (xmlBufGrow(buf, len) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

	res = in->readcallback(in->context, (char *)xmlBufEnd(buf), len);
	if (res <= 0)
	    in->readcallback = endOfInput;
        if (res < 0) {
            if (res == -1)
                in->error = XML_IO_UNKNOWN;
            else
                in->error = -res;
            return(-1);
        }

        if (xmlBufAddLen(buf, res) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
    }

    /*
     * Handle encoding.
     */
    if (in->encoder != NULL) {
        size_t sizeOut;

        /*
         * Don't convert whole buffer when reading from memory.
         */
        if (in->readcallback == NULL)
            sizeOut = len;
        else
            sizeOut = SIZE_MAX;

	if (xmlCharEncInput(in, &sizeOut) < 0)
	    return(-1);
        res = sizeOut;
    }
    return(res);
}